

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall Convolution::convolve(Convolution *this,double *in,int length)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int local_44;
  int local_40;
  int i_5;
  int i_4;
  int i_3;
  double imagp;
  double realp;
  int i_2;
  int i_1;
  int i;
  int length_local;
  double *in_local;
  Convolution *this_local;
  
  if (this->m_filter_len < length) {
    __assert_fail("length <= m_filter_len",
                  "/workspace/llm4binary/github/license_c_cmakelists/osoumen[P]dpcmc/main.cpp",0x6c,
                  "void Convolution::convolve(double *, int)");
  }
  for (i_2 = 0; realp._4_4_ = length, i_2 < length; i_2 = i_2 + 1) {
    this->m_fft_buff[i_2] = in[i_2];
  }
  for (; realp._4_4_ < this->m_fft_len; realp._4_4_ = realp._4_4_ + 1) {
    this->m_fft_buff[realp._4_4_] = 0.0;
  }
  rdft(this->m_fft_len,1,this->m_fft_buff,this->m_ip,this->m_work);
  *this->m_fft_buff = *this->m_filter * *this->m_fft_buff;
  this->m_fft_buff[1] = this->m_filter[1] * this->m_fft_buff[1];
  for (realp._0_4_ = 1; realp._0_4_ < this->m_filter_len; realp._0_4_ = realp._0_4_ + 1) {
    dVar1 = this->m_fft_buff[realp._0_4_ << 1];
    dVar2 = this->m_filter[realp._0_4_ * 2 + 1];
    dVar3 = this->m_fft_buff[realp._0_4_ * 2 + 1];
    dVar4 = this->m_filter[realp._0_4_ << 1];
    this->m_fft_buff[realp._0_4_ << 1] =
         this->m_fft_buff[realp._0_4_ << 1] * this->m_filter[realp._0_4_ << 1] +
         -(this->m_fft_buff[realp._0_4_ * 2 + 1] * this->m_filter[realp._0_4_ * 2 + 1]);
    this->m_fft_buff[realp._0_4_ * 2 + 1] = dVar1 * dVar2 + dVar3 * dVar4;
  }
  rdft(this->m_fft_len,-1,this->m_fft_buff,this->m_ip,this->m_work);
  for (i_5 = 0; i_5 < this->m_fft_len; i_5 = i_5 + 1) {
    this->m_filter_result[i_5] = this->m_fft_buff[i_5] + this->m_filter_result[i_5];
  }
  for (local_40 = 0; local_40 < length; local_40 = local_40 + 1) {
    in[local_40] = this->m_filter_result[local_40];
  }
  for (local_44 = 0; local_44 < this->m_filter_len; local_44 = local_44 + 1) {
    this->m_filter_result[local_44] = this->m_filter_result[local_44 + this->m_filter_len];
    this->m_filter_result[local_44 + this->m_filter_len] = 0.0;
  }
  return;
}

Assistant:

void convolve(double *in, int length)
	{
		assert(length <= m_filter_len);
		
		for (int i=0; i<length; ++i) {
			m_fft_buff[i] = in[i];
		}
		for (int i=length; i<m_fft_len; ++i) {
			m_fft_buff[i] = .0;
		}
		rdft(m_fft_len, 1, m_fft_buff, m_ip, m_work);
		m_fft_buff[0] *= m_filter[0];
		m_fft_buff[1] *= m_filter[1];
		for (int i=1; i<m_filter_len; ++i) {
			double realp = m_fft_buff[2*i] * m_filter[2*i] - m_fft_buff[2*i+1] * m_filter[2*i+1];
			double imagp = m_fft_buff[2*i] * m_filter[2*i+1] + m_fft_buff[2*i+1] * m_filter[2*i];
			m_fft_buff[2*i] = realp;
			m_fft_buff[2*i+1] = imagp;
		}
		rdft(m_fft_len, -1, m_fft_buff, m_ip, m_work);
		for (int i=0; i<m_fft_len; ++i) {
			m_filter_result[i] += m_fft_buff[i];
		}
		for (int i=0; i<length; ++i) {
			in[i] = m_filter_result[i];
		}
		for (int i=0; i<m_filter_len; ++i) {
			m_filter_result[i] = m_filter_result[i+m_filter_len];
			m_filter_result[i+m_filter_len] = .0;
		}
	}